

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O2

void __thiscall
mp::BasicExprFactory<std::allocator<char>>::Deallocate<mp::Function::Impl_const*>
          (BasicExprFactory<std::allocator<char>> *this,
          vector<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_> *data)

{
  pointer ppIVar1;
  pointer ppIVar2;
  
  ppIVar1 = (data->
            super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  for (ppIVar2 = (data->
                 super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
                 )._M_impl.super__Vector_impl_data._M_start; ppIVar2 != ppIVar1;
      ppIVar2 = ppIVar2 + 1) {
    if (*ppIVar2 != (Impl *)0x0) {
      operator_delete__(*ppIVar2);
    }
  }
  return;
}

Assistant:

LogicalCountExpr MakeLogicalCount(
        expr::Kind kind, NumericExpr lhs, CountExpr rhs) {
    return MakeBinary<LogicalCountExpr>(kind, lhs, rhs);
  }